

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallVector.h
# Opt level: O2

iterator __thiscall
llvm::SmallVectorImpl<unsigned_char>::insert<char_const*,void>
          (SmallVectorImpl<unsigned_char> *this,iterator I,char *From,char *To)

{
  void *pvVar1;
  move_iterator<unsigned_char_*> in_end;
  ulong uVar2;
  move_iterator<unsigned_char_*> __result;
  ulong uVar3;
  ulong __n;
  size_t __n_00;
  ulong uVar4;
  iterator puVar5;
  
  puVar5 = (iterator)
           (this->super_SmallVectorTemplateBase<unsigned_char,_true>).
           super_SmallVectorTemplateCommon<unsigned_char,_void>.super_SmallVectorBase.BeginX;
  uVar4 = (long)I - (long)puVar5;
  uVar2 = (ulong)(this->super_SmallVectorTemplateBase<unsigned_char,_true>).
                 super_SmallVectorTemplateCommon<unsigned_char,_void>.super_SmallVectorBase.Size;
  if (puVar5 + uVar2 == I) {
    append<char_const*,void>(this,From,To);
    puVar5 = (iterator)
             (uVar4 + (long)(this->super_SmallVectorTemplateBase<unsigned_char,_true>).
                            super_SmallVectorTemplateCommon<unsigned_char,_void>.
                            super_SmallVectorBase.BeginX);
  }
  else {
    if (I < puVar5) {
      __assert_fail("I >= this->begin() && \"Insertion iterator is out of bounds.\"",
                    "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/include/llvm/ADT/SmallVector.h"
                    ,0x259,
                    "iterator llvm::SmallVectorImpl<unsigned char>::insert(iterator, ItTy, ItTy) [T = unsigned char, ItTy = const char *]"
                   );
    }
    if (puVar5 + uVar2 < I) {
      __assert_fail("I <= this->end() && \"Inserting past the end of the vector.\"",
                    "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/include/llvm/ADT/SmallVector.h"
                    ,0x25a,
                    "iterator llvm::SmallVectorImpl<unsigned char>::insert(iterator, ItTy, ItTy) [T = unsigned char, ItTy = const char *]"
                   );
    }
    uVar3 = (long)To - (long)From;
    reserve(this,uVar2 + uVar3);
    pvVar1 = (this->super_SmallVectorTemplateBase<unsigned_char,_true>).
             super_SmallVectorTemplateCommon<unsigned_char,_void>.super_SmallVectorBase.BeginX;
    puVar5 = (iterator)((long)pvVar1 + uVar4);
    uVar2 = (ulong)(this->super_SmallVectorTemplateBase<unsigned_char,_true>).
                   super_SmallVectorTemplateCommon<unsigned_char,_void>.super_SmallVectorBase.Size;
    in_end._M_current = (uchar *)((long)pvVar1 + uVar2);
    __n = uVar2 - uVar4;
    if (__n < uVar3) {
      SmallVectorBase::set_size((SmallVectorBase *)this,uVar3 + uVar2);
      if (uVar2 != uVar4) {
        memcpy((void *)((long)(this->super_SmallVectorTemplateBase<unsigned_char,_true>).
                              super_SmallVectorTemplateCommon<unsigned_char,_void>.
                              super_SmallVectorBase.BeginX +
                       ((this->super_SmallVectorTemplateBase<unsigned_char,_true>).
                        super_SmallVectorTemplateCommon<unsigned_char,_void>.super_SmallVectorBase.
                        Size - __n)),puVar5,__n);
      }
      for (uVar2 = 0; __n != uVar2; uVar2 = uVar2 + 1) {
        puVar5[uVar2] = From[uVar2];
      }
      From = From + uVar2;
      __result._M_current = in_end._M_current;
    }
    else {
      append<std::move_iterator<unsigned_char*>,void>
                (this,(move_iterator<unsigned_char_*>)(in_end._M_current + -uVar3),in_end);
      __n_00 = (long)(in_end._M_current + -uVar3) - (long)puVar5;
      __result._M_current = puVar5;
      if (__n_00 != 0) {
        memmove(in_end._M_current + -__n_00,puVar5,__n_00);
      }
    }
    std::__copy_move<false,false,std::random_access_iterator_tag>::
    __copy_m<char_const*,unsigned_char*>(From,To,__result._M_current);
  }
  return puVar5;
}

Assistant:

iterator insert(iterator I, ItTy From, ItTy To) {
    // Convert iterator to elt# to avoid invalidating iterator when we reserve()
    size_t InsertElt = I - this->begin();

    if (I == this->end()) {  // Important special case for empty vector.
      append(From, To);
      return this->begin()+InsertElt;
    }

    assert(I >= this->begin() && "Insertion iterator is out of bounds.");
    assert(I <= this->end() && "Inserting past the end of the vector.");

    size_t NumToInsert = std::distance(From, To);

    // Ensure there is enough space.
    reserve(this->size() + NumToInsert);

    // Uninvalidate the iterator.
    I = this->begin()+InsertElt;

    // If there are more elements between the insertion point and the end of the
    // range than there are being inserted, we can use a simple approach to
    // insertion.  Since we already reserved space, we know that this won't
    // reallocate the vector.
    if (size_t(this->end()-I) >= NumToInsert) {
      T *OldEnd = this->end();
      append(std::move_iterator<iterator>(this->end() - NumToInsert),
             std::move_iterator<iterator>(this->end()));

      // Copy the existing elements that get replaced.
      std::move_backward(I, OldEnd-NumToInsert, OldEnd);

      std::copy(From, To, I);
      return I;
    }

    // Otherwise, we're inserting more elements than exist already, and we're
    // not inserting at the end.

    // Move over the elements that we're about to overwrite.
    T *OldEnd = this->end();
    this->set_size(this->size() + NumToInsert);
    size_t NumOverwritten = OldEnd-I;
    this->uninitialized_move(I, OldEnd, this->end()-NumOverwritten);

    // Replace the overwritten part.
    for (T *J = I; NumOverwritten > 0; --NumOverwritten) {
      *J = *From;
      ++J; ++From;
    }

    // Insert the non-overwritten middle part.
    this->uninitialized_copy(From, To, OldEnd);
    return I;
  }